

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

void core::image::jpg_message_handler(j_common_ptr param_1,int msg_level)

{
  Exception *this;
  string local_40;
  
  if (-1 < msg_level) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"JPEG data corrupt","");
  util::Exception::Exception(this,&local_40);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
jpg_message_handler (j_common_ptr /*cinfo*/, int msg_level)
{
    if (msg_level < 0)
        throw util::Exception("JPEG data corrupt");
}